

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

void __thiscall HPresolve::getDualsDoubletonEquation(HPresolve *this,int row,int col)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
  *this_00;
  stack<double,_std::deque<double,_std::allocator<double>_>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  vector<int,_std::allocator<int>_> *this_03;
  vector<double,_std::allocator<double>_> *this_04;
  double dVar2;
  double dVar3;
  double colLow;
  double colUpp;
  double dVar4;
  double colLow_00;
  double colUpp_00;
  double dVar5;
  double dVar6;
  double dVar7;
  value_type vVar8;
  _Elt_pointer pdVar9;
  reference pvVar10;
  reference pvVar11;
  ostream *poVar12;
  size_type __n;
  _Elt_pointer ppVar13;
  size_type __n_00;
  double dVar14;
  double up;
  double lo;
  vector<double,_std::allocator<double>_> v;
  pair<int,_std::vector<double,_std::allocator<double>_>_> p;
  size_type local_f8;
  double local_88;
  double local_80;
  _Vector_base<double,_std::allocator<double>_> local_78;
  double local_60;
  double local_58;
  pair<int,_std::vector<double,_std::allocator<double>_>_> local_50;
  
  this_00 = &(this->super_HPreData).oldBounds;
  ppVar13 = (this->super_HPreData).oldBounds.c.
            super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar13 ==
      *(_Elt_pointer *)
       ((long)&(this->super_HPreData).oldBounds.c.
               super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish + 8)) {
    ppVar13 = (*(_Map_pointer *)
                ((long)&(this->super_HPreData).oldBounds.c.
                        super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish + 0x18))[-1] + 0x10;
  }
  std::pair<int,_std::vector<double,_std::allocator<double>_>_>::pair(&local_50,ppVar13 + -1);
  std::
  deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::pop_back(&this_00->c);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_78,&local_50.second);
  ppVar13 = (this->super_HPreData).oldBounds.c.
            super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar13 ==
      *(_Elt_pointer *)
       ((long)&(this->super_HPreData).oldBounds.c.
               super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish + 8)) {
    ppVar13 = (*(_Map_pointer *)
                ((long)&(this->super_HPreData).oldBounds.c.
                        super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish + 0x18))[-1] + 0x10;
  }
  local_f8 = (size_type)local_50.first;
  dVar2 = *local_78._M_impl.super__Vector_impl_data._M_start;
  dVar3 = local_78._M_impl.super__Vector_impl_data._M_start[1];
  dVar14 = local_78._M_impl.super__Vector_impl_data._M_start[2];
  std::pair<int,_std::vector<double,_std::allocator<double>_>_>::operator=(&local_50,ppVar13 + -1);
  std::
  deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::pop_back(&this_00->c);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)&local_78,&local_50.second);
  ppVar13 = (this->super_HPreData).oldBounds.c.
            super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar13 ==
      *(_Elt_pointer *)
       ((long)&(this->super_HPreData).oldBounds.c.
               super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish + 8)) {
    ppVar13 = (*(_Map_pointer *)
                ((long)&(this->super_HPreData).oldBounds.c.
                        super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish + 0x18))[-1] + 0x10;
  }
  colLow = *local_78._M_impl.super__Vector_impl_data._M_start;
  colUpp = local_78._M_impl.super__Vector_impl_data._M_start[1];
  dVar4 = local_78._M_impl.super__Vector_impl_data._M_start[2];
  std::pair<int,_std::vector<double,_std::allocator<double>_>_>::operator=(&local_50,ppVar13 + -1);
  std::
  deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::pop_back(&this_00->c);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)&local_78,&local_50.second);
  this_01 = &(this->super_HPreData).postValue;
  pdVar9 = (this->super_HPreData).postValue.c.super__Deque_base<double,_std::allocator<double>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pdVar9 == *(_Elt_pointer *)
                 ((long)&(this->super_HPreData).postValue.c.
                         super__Deque_base<double,_std::allocator<double>_>._M_impl.
                         super__Deque_impl_data._M_finish + 8)) {
    pdVar9 = (*(_Map_pointer *)
               ((long)&(this->super_HPreData).postValue.c.
                       super__Deque_base<double,_std::allocator<double>_>._M_impl.
                       super__Deque_impl_data._M_finish + 0x18))[-1] + 0x40;
  }
  colLow_00 = *local_78._M_impl.super__Vector_impl_data._M_start;
  colUpp_00 = local_78._M_impl.super__Vector_impl_data._M_start[1];
  local_60 = local_78._M_impl.super__Vector_impl_data._M_start[2];
  dVar5 = pdVar9[-1];
  std::deque<double,_std::allocator<double>_>::pop_back(&this_01->c);
  pdVar9 = (this->super_HPreData).postValue.c.super__Deque_base<double,_std::allocator<double>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pdVar9 == *(_Elt_pointer *)
                 ((long)&(this->super_HPreData).postValue.c.
                         super__Deque_base<double,_std::allocator<double>_>._M_impl.
                         super__Deque_impl_data._M_finish + 8)) {
    pdVar9 = (*(_Map_pointer *)
               ((long)&(this->super_HPreData).postValue.c.
                       super__Deque_base<double,_std::allocator<double>_>._M_impl.
                       super__Deque_impl_data._M_finish + 0x18))[-1] + 0x40;
  }
  dVar6 = pdVar9[-1];
  std::deque<double,_std::allocator<double>_>::pop_back(&this_01->c);
  pdVar9 = (this->super_HPreData).postValue.c.super__Deque_base<double,_std::allocator<double>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pdVar9 == *(_Elt_pointer *)
                 ((long)&(this->super_HPreData).postValue.c.
                         super__Deque_base<double,_std::allocator<double>_>._M_impl.
                         super__Deque_impl_data._M_finish + 8)) {
    pdVar9 = (*(_Map_pointer *)
               ((long)&(this->super_HPreData).postValue.c.
                       super__Deque_base<double,_std::allocator<double>_>._M_impl.
                       super__Deque_impl_data._M_finish + 0x18))[-1] + 0x40;
  }
  local_58 = pdVar9[-1];
  std::deque<double,_std::allocator<double>_>::pop_back(&this_01->c);
  this_02 = &(this->super_HPreData).valuePrimal;
  pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_02,local_f8);
  dVar7 = *pvVar10;
  __n_00 = (size_type)col;
  pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_00);
  *pvVar10 = (dVar5 - local_58 * dVar7) / dVar6;
  pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_00);
  this->objShift = local_60 * *pvVar10 + (dVar4 * dVar7 - dVar14 * dVar7) + this->objShift;
  pvVar10 = std::vector<double,_std::allocator<double>_>::at
                      (&(this->super_HPreData).colCostAtEl,local_f8);
  *pvVar10 = dVar4;
  this_03 = &(this->super_HPreData).Aend;
  std::vector<int,_std::allocator<int>_>::at(this_03,__n_00);
  pvVar1 = &(this->super_HPreData).Astart;
  std::vector<int,_std::allocator<int>_>::at(pvVar1,__n_00);
  pvVar11 = std::vector<int,_std::allocator<int>_>::at(pvVar1,__n_00);
  pvVar1 = &(this->super_HPreData).flagRow;
  for (__n = (size_type)*pvVar11;
      pvVar11 = std::vector<int,_std::allocator<int>_>::at(this_03,__n_00),
      (long)__n < (long)*pvVar11; __n = __n + 1) {
    pvVar11 = std::vector<int,_std::allocator<int>_>::at(&(this->super_HPreData).Aindex,__n);
    std::vector<int,_std::allocator<int>_>::at(pvVar1,(long)*pvVar11);
  }
  local_80 = -1e+200;
  local_88 = 1e+200;
  getBoundOnLByZj(this,row,local_50.first,&local_80,&local_88,colLow,colUpp);
  getBoundOnLByZj(this,row,col,&local_80,&local_88,colLow_00,colUpp_00);
  dVar4 = local_80;
  dVar14 = local_88;
  if (this->tol <= local_80 - local_88 && local_80 - local_88 != this->tol) {
    poVar12 = std::operator<<((ostream *)&std::cout,"PR: Error in postsolving doubleton equation ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,row);
    std::operator<<(poVar12," : inconsistent bounds for it\'s dual value.\n");
  }
  if ((0.0 < dVar4) || (dVar14 < 0.0)) {
    if (dVar4 <= 0.0) {
      if (0.0 <= dVar14) goto LAB_00146def;
      pvVar10 = std::vector<double,_std::allocator<double>_>::at
                          (&(this->super_HPreData).valueRowDual,(long)row);
    }
    else {
      pvVar10 = std::vector<double,_std::allocator<double>_>::at
                          (&(this->super_HPreData).valueRowDual,(long)row);
      dVar14 = dVar4;
    }
    *pvVar10 = dVar14;
  }
  else {
    pvVar10 = std::vector<double,_std::allocator<double>_>::at
                        (&(this->super_HPreData).valueRowDual,(long)row);
    *pvVar10 = 0.0;
  }
LAB_00146def:
  pvVar11 = std::vector<int,_std::allocator<int>_>::at(pvVar1,(long)row);
  *pvVar11 = 1;
  dVar14 = getColumnDualPost(this,col);
  this_04 = &(this->super_HPreData).valueColDual;
  pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_04,__n_00);
  *pvVar10 = dVar14;
  dVar14 = getColumnDualPost(this,local_50.first);
  pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_04,local_f8);
  *pvVar10 = dVar14;
  if (this->iKKTcheck == 1) {
    pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_04,local_f8);
    vVar8 = *pvVar10;
    pvVar10 = std::vector<double,_std::allocator<double>_>::at
                        (&(this->super_HPreData).chk.colDual,local_f8);
    *pvVar10 = vVar8;
  }
  pvVar1 = &(this->super_HPreData).nonbasicFlag;
  pvVar11 = std::vector<int,_std::allocator<int>_>::at(pvVar1,local_f8);
  if ((((*pvVar11 != 1) || (dVar7 != dVar3)) || (colUpp <= dVar3)) &&
     (((pvVar11 = std::vector<int,_std::allocator<int>_>::at(pvVar1,local_f8), *pvVar11 != 1 ||
       (dVar7 != dVar2)) || (dVar2 <= colLow)))) {
    pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_00);
    dVar14 = this->tol;
    local_f8 = __n_00;
    if (dVar14 < *pvVar10 - colLow_00) {
      pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_02,__n_00);
      dVar14 = this->tol;
      if (dVar14 < colUpp_00 - *pvVar10) goto LAB_00146f94;
    }
    if ((dVar14 <= ABS(dVar7 - dVar3)) && (dVar14 <= ABS(dVar7 - dVar2))) {
      pvVar11 = (this->super_HPreData).nonbasicFlag.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start +
                (long)row + (long)(this->super_HPreData).numColOriginal;
      goto LAB_00146fa1;
    }
  }
LAB_00146f94:
  pvVar11 = std::vector<int,_std::allocator<int>_>::at(pvVar1,local_f8);
LAB_00146fa1:
  *pvVar11 = 0;
  pvVar11 = std::vector<int,_std::allocator<int>_>::at(&(this->super_HPreData).flagCol,__n_00);
  *pvVar11 = 1;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_50.second.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void HPresolve::getDualsDoubletonEquation(int row, int col) {
	// colDual already set. need valuePrimal from stack. maybe change rowDual depending on bounds. old bounds kept in oldBounds.
	// variables j,k : we eliminated col(k)(c.col) and are left with changed bounds on j and no row.
	//                               y                                                 x

	pair< int ,vector<double> > p = oldBounds.top(); oldBounds.pop();
	vector<double> v = get<1>(p);
	int x = get<0>(p);
	double ubxNew = v[1];
	double lbxNew = v[0];
	double cxNew = v[2];
	p = oldBounds.top(); oldBounds.pop();
	v = get<1>(p);
	double ubxOld = v[1];
	double lbxOld = v[0];
	double cxOld = v[2];
	p = oldBounds.top(); oldBounds.pop();
	v = get<1>(p);
	double uby = v[1];
	double lby = v[0];
	double cy = v[2];

	int y = col;

	double b = postValue.top(); postValue.pop();
	double aky = postValue.top(); postValue.pop();
	double akx = postValue.top(); postValue.pop();
	double valueX = valuePrimal.at(x);

	// primal value and objective shift
	valuePrimal.at(y) = (b - akx*valueX)/aky;
	objShift += -cxNew*valueX + cxOld*valueX + cy*valuePrimal.at(y);

	//column cost of x
	colCostAtEl.at(x) = cxOld;


	//get nzCol.at(y) before unflag row as missing
	int nzy = Aend.at(y) - Astart.at(y);
	for (int kk=Astart.at(y); kk<Aend.at(y); ++kk)
		if (!flagRow.at(Aindex.at(kk)))
			nzy--;


	double lo = -HSOL_CONST_INF;
	double up = HSOL_CONST_INF;

	getBoundOnLByZj(row, x, &lo, &up, lbxOld, ubxOld);
	getBoundOnLByZj(row, y, &lo, &up, lby,    uby);

		//calculate yi
	if (lo-up > tol)
		cout<<"PR: Error in postsolving doubleton equation "<<row <<" : inconsistent bounds for it's dual value.\n";

	if (lo<=0 && up>=0) {
		valueRowDual.at(row) = 0;
	}
	else if (lo>0) {
		valueRowDual.at(row) = lo;
	}
	else if (up<0) {
		valueRowDual.at(row) = up;
	}

	flagRow.at(row) = 1;
	valueColDual.at(y) = getColumnDualPost(y);
	valueColDual.at(x) = getColumnDualPost(x);

	if (iKKTcheck == 1)
		chk.colDual.at(x) = valueColDual.at(x);

	if ((nonbasicFlag.at(x) == 1 && valueX==ubxNew && ubxNew < ubxOld)  ||
		(nonbasicFlag.at(x) == 1 && valueX==lbxNew && lbxNew > lbxOld))   {
			nonbasicFlag.at(x) = 0;
	}
	else {
		//row becomes basic unless y is between bounds, in which case y is basic
		if (valuePrimal.at(y) - lby > tol  && uby - valuePrimal.at(y) > tol) {
			nonbasicFlag.at(y) = 0;
		}
		else if (abs(valueX-ubxNew ) < tol || abs(valueX-lbxNew ) < tol)
			nonbasicFlag.at(y) = 0;
		else
			nonbasicFlag[numColOriginal + row] = 0;
	}

	//flagRow.at(row) = true;
	flagCol.at(y) = 1;
}